

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biattentional.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer target;
  vector<int,_std::allocator<int>_> *cg;
  pointer pbVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  __pid_t _Var9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar13;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar14;
  typed_value<int,_char> *ptVar15;
  const_iterator cVar16;
  any *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  ostream *poVar19;
  uint *puVar20;
  void *pvVar21;
  const_iterator cVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar23;
  Tensor *pTVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int *w;
  int *piVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  char **in_RSI;
  size_type __n;
  int in_EDI;
  VariableIndex VVar30;
  uint uVar31;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *spair;
  uint uVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  int iVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined4 uVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar43 [64];
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM3_Qb;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_files;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  variables_map vm;
  text_iarchive ia;
  ifstream in;
  options_description opts;
  string line;
  Model model;
  BidirAttentionalModel<dynet::LSTMBuilder> am;
  double local_1060;
  ulong local_1058;
  double local_1050;
  double local_1048;
  double local_1040;
  double local_1038;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1018;
  double local_1000;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ff8;
  ulong local_ff0;
  int local_fe4;
  int local_fe0;
  uint local_fdc;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_fd8;
  ulong local_fb8;
  char *local_fb0;
  long local_fa8;
  char local_fa0 [20];
  uint local_f8c;
  uint local_f88;
  uint local_f84;
  uint local_f80;
  uint local_f7c;
  uint local_f78;
  uint local_f74;
  uint local_f70;
  uint local_f6c;
  uint local_f68;
  uint local_f64;
  uint local_f60;
  int local_f5c;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_f58;
  undefined1 local_f40 [32];
  time_point local_f20;
  double local_f18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f10;
  code *local_ef8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_ee8 [8];
  _Rb_tree_node_base local_ee0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_eb8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e88;
  undefined8 local_e58;
  pointer local_e50;
  code *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined1 local_e30;
  undefined4 local_e2c;
  undefined1 local_e28 [16];
  undefined2 local_e18;
  Model *local_e10;
  char **local_e08;
  undefined1 local_e00 [48];
  basic_text_oprimitive<std::ostream> local_dd0 [88];
  undefined1 local_d78 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_d70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d68 [14];
  ios_base local_c80 [280];
  undefined1 *local_b68 [2];
  undefined1 local_b58 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b40 [24];
  void *local_b28;
  undefined4 local_b20;
  undefined8 local_b18;
  undefined4 local_b10;
  undefined8 local_b08;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_b00 [24];
  undefined1 *local_ae8;
  undefined8 local_ae0;
  undefined1 local_ad8 [16];
  key_type local_ac8 [4];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a38;
  undefined1 local_a18 [112];
  ios_base local_9a8 [1112];
  AttentionalModel<dynet::LSTMBuilder> local_550;
  Expression local_80;
  Expression local_70;
  VariableIndex local_58;
  VariableIndex local_48;
  VariableIndex local_38;
  
  auVar42 = in_ZMM2._0_16_;
  local_f5c = in_EDI;
  local_e08 = in_RSI;
  dynet::initialize(&local_f5c,&local_e08,false);
  boost::program_options::variables_map::variables_map((variables_map *)local_ef8);
  pbVar1 = (pointer)(local_a18 + 0x10);
  local_a18._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_b68,(string *)local_a18,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_a18._0_8_ != pbVar1) {
    operator_delete((void *)local_a18._0_8_);
  }
  local_a18._0_8_ = boost::program_options::options_description::add_options();
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_a18,"help");
  ptVar13 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"config,c",(char *)ptVar13);
  ptVar13 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"train,t",(char *)ptVar13);
  ptVar13 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"devel,d",(char *)ptVar13);
  ptVar13 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"rescore,r",(char *)ptVar13);
  ptVar13 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"parameters,p",(char *)ptVar13);
  ptVar14 = boost::program_options::
            value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x0);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"initialise,i",(char *)ptVar14);
  ptVar15 = boost::program_options::value<int>((int *)0x0);
  local_d78._0_4_ = LAYERS;
  ptVar15 = boost::program_options::typed_value<int,_char>::default_value(ptVar15,(int *)local_d78);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"layers,l",(char *)ptVar15);
  ptVar15 = boost::program_options::value<int>((int *)0x0);
  local_ac8[0]._M_dataplus._M_p._0_4_ = ALIGN_DIM;
  ptVar15 = boost::program_options::typed_value<int,_char>::default_value(ptVar15,(int *)local_ac8);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"align,a",(char *)ptVar15);
  ptVar15 = boost::program_options::value<int>((int *)0x0);
  local_e00._0_4_ = HIDDEN_DIM;
  ptVar15 = boost::program_options::typed_value<int,_char>::default_value(ptVar15,(int *)local_e00);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"hidden,h",(char *)ptVar15);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"bidirectional");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"giza");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"gz-position");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"gz-markov");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"gz-fertility");
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"curriculum");
  boost::program_options::options_description_easy_init::operator()(pcVar12,"fertility,f");
  local_a38.super_function_base.vtable = (vtable_base *)0x0;
  local_a38.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_a38.super_function_base.functor._8_8_ = 0;
  local_a38.super_function_base.functor._16_8_ = 0;
  auVar43 = ZEXT1664(auVar42);
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_a18,local_f5c,local_e08,
             (options_description *)local_b68,0,&local_a38);
  boost::program_options::store(local_a18,(variables_map *)local_ef8,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_a18);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_a38);
  local_a18._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"config","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_ee8,(key_type *)local_a18);
  if ((pointer)local_a18._0_8_ != pbVar1) {
    operator_delete((void *)local_a18._0_8_);
  }
  if (cVar16._M_node != &local_ee0) {
    local_d78 = (undefined1  [8])local_d68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"config","");
    paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_ef8)
    ;
    pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
    std::ifstream::ifstream(local_a18,(pbVar18->_M_dataplus)._M_p,_S_in);
    if (local_d78 != (undefined1  [8])local_d68) {
      operator_delete((void *)local_d78);
    }
    boost::program_options::parse_config_file<char>
              ((istream *)local_d78,(options_description *)local_a18,SUB81(local_b68,0));
    boost::program_options::store(local_d78,(variables_map *)local_ef8,false);
    std::
    vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
    ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               *)local_d78);
    std::ifstream::~ifstream(local_a18);
  }
  boost::program_options::notify((variables_map *)local_ef8);
  local_a18._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"help","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_ee8,(key_type *)local_a18);
  bVar35 = true;
  if (cVar16._M_node == &local_ee0) {
    local_d78 = (undefined1  [8])local_d68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"train","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_d78);
    if (cVar16._M_node == &local_ee0) {
      bVar35 = true;
    }
    else {
      local_ac8[0]._M_dataplus._M_p = (pointer)((long)local_ac8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"devel","");
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_ee8,local_ac8);
      if (cVar16._M_node == &local_ee0) {
        local_e00._0_8_ = local_e00 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e00,"rescore","");
        cVar16 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find(local_ee8,(key_type *)local_e00);
        bVar35 = cVar16._M_node == &local_ee0;
        if ((undefined1 *)local_e00._0_8_ != local_e00 + 0x10) {
          operator_delete((void *)local_e00._0_8_);
        }
      }
      else {
        bVar35 = false;
      }
      if (local_ac8[0]._M_dataplus._M_p != (pointer)((long)local_ac8 + 0x10)) {
        operator_delete(local_ac8[0]._M_dataplus._M_p);
      }
    }
    if (local_d78 != (undefined1  [8])local_d68) {
      operator_delete((void *)local_d78);
    }
  }
  if ((pointer)local_a18._0_8_ != pbVar1) {
    operator_delete((void *)local_a18._0_8_);
  }
  if (bVar35) {
    poVar19 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cout,(options_description *)local_b68);
    iVar10 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
  }
  else {
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"<s>","");
    kSRC_SOS = dynet::Dict::convert(&sd,(string *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"</s>","");
    kSRC_EOS = dynet::Dict::convert(&sd,(string *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"<s>","");
    kTGT_SOS = dynet::Dict::convert(&td,(string *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"</s>","");
    kTGT_EOS = dynet::Dict::convert(&td,(string *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_ae8 = local_ad8;
    local_fd8.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f58.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1018.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_ae0 = 0;
    local_fd8.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_fd8.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f58.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f58.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1018.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1018.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_ad8[0] = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading training data from ",0x1b);
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"train","");
    paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_ef8)
    ;
    pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"...\n",4);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"train","");
    paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_ef8)
    ;
    pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
    read_corpus((Corpus *)local_ac8,pbVar18);
    uVar8 = local_ac8[0].field_2._M_allocated_capacity;
    local_d68[0]._0_8_ =
         local_fd8.
         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    paStack_d70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_fd8.
                     super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
    local_d78 = (undefined1  [8])
                local_fd8.
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_ac8[0].field_2._M_allocated_capacity = 0;
    local_fd8.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar8;
    local_fd8.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_ac8[0]._M_dataplus._M_p;
    local_fd8.
    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_ac8[0]._M_string_length;
    local_ac8[0]._0_16_ = ZEXT816(0) << 0x20;
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)local_d78);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)local_ac8);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    sd.frozen = true;
    td.frozen = true;
    VOCAB_SIZE_SRC =
         (uint)((ulong)((long)sd.words_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)sd.words_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
    VOCAB_SIZE_TGT =
         (uint)((ulong)((long)td.words_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)td.words_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"devel","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    if (cVar16._M_node != &local_ee0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Reading dev data from ",0x16);
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"devel","");
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_ef8);
      pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(pbVar18->_M_dataplus)._M_p,
                           pbVar18->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"...\n",4);
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"devel","");
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_ef8);
      pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
      read_corpus((Corpus *)local_ac8,pbVar18);
      uVar8 = local_ac8[0].field_2._M_allocated_capacity;
      local_d68[0]._0_8_ =
           local_f58.
           super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      paStack_d70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f58.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      local_d78 = (undefined1  [8])
                  local_f58.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_ac8[0].field_2._M_allocated_capacity = 0;
      local_f58.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar8;
      local_f58.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_ac8[0]._M_dataplus._M_p;
      local_f58.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_ac8[0]._M_string_length;
      local_ac8[0]._0_16_ = ZEXT816(0) << 0x20;
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)local_d78);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)local_ac8);
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"rescore","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    if (cVar16._M_node != &local_ee0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Reading test data from ",0x17);
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"rescore","");
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_ef8);
      pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(pbVar18->_M_dataplus)._M_p,
                           pbVar18->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"...\n",4);
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"rescore","");
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_ef8);
      pbVar18 = boost::any_cast<std::__cxx11::string_const&>(paVar17);
      read_corpus((Corpus *)local_ac8,pbVar18);
      uVar8 = local_ac8[0].field_2._M_allocated_capacity;
      local_d68[0]._0_8_ =
           local_1018.
           super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      paStack_d70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1018.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      local_d78 = (undefined1  [8])
                  local_1018.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_ac8[0].field_2._M_allocated_capacity = 0;
      local_1018.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar8;
      local_1018.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_ac8[0]._M_dataplus._M_p;
      local_1018.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_ac8[0]._M_string_length;
      local_ac8[0]._0_16_ = ZEXT816(0) << 0x20;
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)local_d78);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)local_ac8);
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"layers","");
    paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_ef8)
    ;
    puVar20 = (uint *)boost::any_cast<int_const&>(paVar17);
    LAYERS = *puVar20;
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"align","");
    paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_ef8)
    ;
    puVar20 = (uint *)boost::any_cast<int_const&>(paVar17);
    ALIGN_DIM = *puVar20;
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"hidden","");
    paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_ef8)
    ;
    puVar20 = (uint *)boost::any_cast<int_const&>(paVar17);
    HIDDEN_DIM = *puVar20;
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"bidirectional","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_a18);
    BIDIR = cVar16._M_node != &local_ee0;
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"giza","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    if (cVar16._M_node == &local_ee0) {
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"gz-position","");
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_ee8,(key_type *)local_a18);
      GIZA_P = cVar16._M_node != &local_ee0;
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"gz-markov","");
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_ee8,(key_type *)local_a18);
      GIZA_M = cVar16._M_node != &local_ee0;
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"gz-fertility","");
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_ee8,(key_type *)local_a18);
      GIZA_F = cVar16._M_node != &local_ee0;
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
    }
    else {
      GIZA_P = true;
      GIZA_M = true;
      GIZA_F = true;
    }
    local_fb0 = local_fa0;
    local_fa8 = 0;
    local_fa0[0] = '\0';
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"parameters","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    if (cVar16._M_node == &local_ee0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a18,"bam",3);
      local_d78[0] = (string)0x5f;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a18,local_d78,1)
      ;
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
      local_d78[0] = (string)0x5f;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
      local_d78[0] = (string)0x5f;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"_lstm",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"_b",2);
      poVar19 = std::ostream::_M_insert<bool>(SUB81(poVar19,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"_g",2);
      pvVar21 = (void *)std::ostream::operator<<(poVar19,(uint)GIZA_P);
      pvVar21 = (void *)std::ostream::operator<<(pvVar21,(uint)GIZA_M);
      poVar19 = (ostream *)std::ostream::operator<<(pvVar21,(uint)GIZA_F);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"-pid",4);
      _Var9 = getpid();
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,_Var9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,".params",7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_fb0,(string *)local_d78);
      if (local_d78 != (undefined1  [8])local_d68) {
        operator_delete((void *)local_d78);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a18);
      std::ios_base::~ios_base(local_9a8);
    }
    else {
      local_a18._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"parameters","");
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_ef8);
      boost::any_cast<std::__cxx11::string_const&>(paVar17);
      std::__cxx11::string::_M_assign((string *)&local_fb0);
      if ((pointer)local_a18._0_8_ != pbVar1) {
        operator_delete((void *)local_a18._0_8_);
      }
    }
    local_a18._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"initialise","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_a18);
    if ((pointer)local_a18._0_8_ != pbVar1) {
      operator_delete((void *)local_a18._0_8_);
    }
    if (cVar16._M_node == &local_ee0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Parameters will be written to: ",0x1f);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_fb0,local_fa8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
      std::ostream::put((char)poVar19);
      std::ostream::flush();
    }
    dynet::Model::Model((Model *)local_ac8);
    local_e40 = 0x3dcccccd3dcccccd;
    uStack_e38 = 0;
    local_e28 = ZEXT816(0) << 0x20;
    local_e30 = 1;
    local_e2c = 0x40a00000;
    local_e18 = 1;
    local_e48 = _ITM_deregisterTMCloneTable;
    local_e10 = (Model *)local_ac8;
    BidirAttentionalModel<dynet::LSTMBuilder>::BidirAttentionalModel
              ((BidirAttentionalModel<dynet::LSTMBuilder> *)local_a18,(Model *)local_ac8,0.1);
    local_d78 = (undefined1  [8])local_d68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"rescore","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_d78);
    if (local_d78 != (undefined1  [8])local_d68) {
      operator_delete((void *)local_d78);
    }
    if (cVar16._M_node != &local_ee0) {
      BidirAttentionalModel<dynet::LSTMBuilder>::add_fertility_params
                ((BidirAttentionalModel<dynet::LSTMBuilder> *)local_a18,(Model *)local_ac8);
    }
    local_d78 = (undefined1  [8])local_d68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"initialise","");
    cVar22 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_d78);
    if (local_d78 != (undefined1  [8])local_d68) {
      operator_delete((void *)local_d78);
    }
    if (cVar22._M_node != &local_ee0) {
      local_d78 = (undefined1  [8])local_d68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"initialise","");
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_ef8);
      __x = boost::
            any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                      (paVar17);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f40,__x);
      if (local_d78 != (undefined1  [8])local_d68) {
        operator_delete((void *)local_d78);
      }
      lVar23 = (long)(local_f40._8_8_ - local_f40._0_8_) >> 5;
      if (lVar23 == 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"initialising from ",0x12);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,*(char **)local_f40._0_8_,
                             *(long *)(local_f40._0_8_ + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," and ",5);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(((string *)(local_f40._0_8_ + 0x20))->_M_dataplus)._M_p,
                             *(long *)(local_f40._0_8_ + 0x28));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
        BidirAttentionalModel<dynet::LSTMBuilder>::initialise
                  ((BidirAttentionalModel<dynet::LSTMBuilder> *)local_a18,(string *)local_f40._0_8_,
                   (string *)(local_f40._0_8_ + 0x20),(Model *)local_ac8);
      }
      else {
        if (lVar23 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                        ,0x116,"int main(int, char **)");
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Parameters will be loaded from: ",0x20);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,*(char **)local_f40._0_8_,
                             *(long *)(local_f40._0_8_ + 8));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
        std::ifstream::ifstream(local_d78,(string *)local_f40._0_8_,_S_in);
        boost::archive::text_iarchive::text_iarchive
                  ((text_iarchive *)local_e00,(istream *)local_d78,0);
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_dynet::Model>_>
        ::get_instance();
        boost::archive::detail::basic_iarchive::load_object
                  (local_e00,(basic_iserializer *)local_ac8);
        boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_e00);
        boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
                  ((basic_text_iprimitive<std::istream> *)(local_e00 + 0x28));
        std::ifstream::~ifstream(local_d78);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f40);
    }
    local_d78 = (undefined1  [8])local_d68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"fertility","");
    cVar22 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_d78);
    FERT = cVar22._M_node != &local_ee0;
    if (local_d78 != (undefined1  [8])local_d68) {
      operator_delete((void *)local_d78);
    }
    if ((cVar16._M_node == &local_ee0) && ((FERT & 1U) != 0)) {
      BidirAttentionalModel<dynet::LSTMBuilder>::add_fertility_params
                ((BidirAttentionalModel<dynet::LSTMBuilder> *)local_a18,(Model *)local_ac8);
    }
    local_d78 = (undefined1  [8])local_d68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"rescore","");
    cVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_ee8,(key_type *)local_d78);
    if (local_d78 != (undefined1  [8])local_d68) {
      operator_delete((void *)local_d78);
    }
    auVar42 = auVar43._0_16_;
    if (cVar16._M_node == &local_ee0) {
      __n = ((long)local_fd8.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_fd8.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_f10,__n,(allocator_type *)local_d78);
      if ((long)local_f10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        uVar27 = 0;
        do {
          local_f10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar27] = (uint)uVar27;
          uVar27 = uVar27 + 1;
        } while ((uVar27 & 0xffffffff) <
                 (ulong)((long)local_f10.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_f10.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      local_fe0 = 0;
      local_fe4 = 0;
      local_f18 = 9e+99;
      local_e58 = _LSTMBuilder;
      local_e50 = _VTT;
      local_fdc = (uint)CONCAT71((int7)((ulong)_LSTMBuilder >> 8),1);
      do {
        local_d78 = (undefined1  [8])local_d68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d78,"completed in","");
        local_f40._0_8_ = local_f40 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f40,local_d78,(char *)((long)local_d78 + (long)paStack_d70));
        local_f20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        if (local_d78 != (undefined1  [8])local_d68) {
          operator_delete((void *)local_d78);
        }
        local_fe4 = local_fe4 + 0x32;
        iVar11 = 0x32;
        uVar27 = 0;
        iVar34 = 0;
        iVar10 = 0;
        local_1050 = 0.0;
        local_1040 = 0.0;
        local_1038 = 0.0;
        local_1048 = 0.0;
        do {
          if (((long)local_fd8.
                     super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_fd8.
                     super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
              (__n & 0xffffffff) == 0) {
            if ((local_fdc & 1) == 0) {
              auVar43 = ZEXT464(0x3f800000);
              fVar36 = uStack_e38._4_4_ + 1.0;
              uStack_e38 = CONCAT44(fVar36,(uint)uStack_e38);
              auVar42 = vfmadd132ss_fma(ZEXT416((uint)fVar36),auVar43._0_16_,
                                        ZEXT416((uint)uStack_e38));
              local_e40 = CONCAT44((float)local_e40 / auVar42._0_4_,(float)local_e40);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"**SHUFFLE\n",10);
            __n = 0;
            std::
            shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )local_f10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )local_f10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,dynet::rndeng);
            local_fdc = 0;
          }
          local_ff0 = uVar27;
          dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_d78);
          cg = &local_fd8.
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [local_f10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[__n & 0xffffffff]].second;
          target = local_fd8.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   local_f10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[__n & 0xffffffff];
          uVar26 = (long)(cg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(cg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar25 = (long)(((pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                            *)(cg + -1))->first).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(((pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                            *)(cg + -1))->first).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          uVar27 = uVar26;
          if (uVar26 < uVar25) {
            uVar27 = uVar25;
          }
          BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                    ((BidirAttentionalModel<dynet::LSTMBuilder> *)local_e00,
                     (vector<int,_std::allocator<int>_> *)local_a18,&target->first,
                     (ComputationGraph *)cg);
          pTVar24 = (Tensor *)dynet::ComputationGraph::forward((Expression *)local_d78);
          uVar39 = dynet::as_scalar(pTVar24);
          local_ff8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_ff8._4_4_,uVar39);
          local_f6c = local_58.t;
          pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
          fVar36 = (float)dynet::as_scalar(pTVar24);
          local_f70 = local_48.t;
          pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
          uVar39 = dynet::as_scalar(pTVar24);
          local_1000 = (double)CONCAT44(local_1000._4_4_,uVar39);
          local_f74 = local_38.t;
          pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
          uVar39 = dynet::as_scalar(pTVar24);
          local_fb8 = CONCAT44(local_fb8._4_4_,uVar39);
          dynet::ComputationGraph::backward((Expression *)local_d78);
          dynet::Trainer::update(1.0);
          local_1058._0_4_ = (int)__n;
          if ((int)local_1058 == 0) {
            dynet::AttentionalModel<dynet::LSTMBuilder>::display_ascii
                      ((AttentionalModel<dynet::LSTMBuilder> *)local_a18,&target->first,cg,
                       (ComputationGraph *)local_d78,&local_80,&sd,&td);
            dynet::AttentionalModel<dynet::LSTMBuilder>::display_ascii
                      (&local_550,cg,&target->first,(ComputationGraph *)local_d78,&local_70,&td,&sd)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\txent_s2t ",10);
            local_f78 = local_58.t;
            pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
            fVar37 = (float)dynet::as_scalar(pTVar24);
            poVar19 = std::ostream::_M_insert<double>((double)fVar37);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\txent_t2s ",10);
            local_f7c = local_48.t;
            pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
            fVar37 = (float)dynet::as_scalar(pTVar24);
            poVar19 = std::ostream::_M_insert<double>((double)fVar37);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\ttrace ",7);
            local_f80 = local_38.t;
            pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
            fVar37 = (float)dynet::as_scalar(pTVar24);
            poVar19 = std::ostream::_M_insert<double>((double)fVar37);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
          }
          iVar10 = iVar10 + -1 + (int)uVar25;
          __n = (size_type)((int)local_1058 + 1);
          local_1048 = local_1048 + (double)local_ff8._0_4_;
          iVar34 = iVar34 + -1 + (int)uVar26;
          uVar31 = (int)local_ff0 + -1 + (int)uVar27;
          uVar27 = (ulong)uVar31;
          local_1038 = local_1038 + (double)fVar36;
          local_1040 = local_1040 + (double)local_1000._0_4_;
          local_1050 = local_1050 + (double)(float)local_fb8;
          dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_d78);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        dynet::Trainer::status((Trainer *)&local_e48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," E = ",5);
        auVar42 = vcvtusi2sd_avx512f(auVar43._0_16_,iVar10 + iVar34);
        local_1048 = local_1048 / auVar42._0_8_;
        poVar19 = std::ostream::_M_insert<double>(local_1048);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," ppl=",5);
        dVar41 = exp(local_1048);
        poVar19 = std::ostream::_M_insert<double>(dVar41);
        local_d78[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_d78,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ppl_s = ",9);
        auVar42 = vcvtusi2sd_avx512f(auVar43._0_16_,iVar10);
        dVar41 = exp(local_1040 / auVar42._0_8_);
        poVar19 = std::ostream::_M_insert<double>(dVar41);
        local_d78[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_d78,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ppl_t = ",9);
        auVar42 = vcvtusi2sd_avx512f(auVar43._0_16_,iVar34);
        dVar41 = exp(local_1038 / auVar42._0_8_);
        poVar19 = std::ostream::_M_insert<double>(dVar41);
        local_d78[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_d78,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," trace = ",9);
        auVar42 = vcvtusi2sd_avx512f(auVar43._0_16_,uVar31);
        dVar41 = exp(local_1050 / auVar42._0_8_);
        poVar19 = std::ostream::_M_insert<double>(dVar41);
        local_d78[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_d78,1);
        local_fe0 = local_fe0 + 1;
        if (((uint)(local_fe0 * 0x26e978d5) >> 2 | local_fe0 * 0x40000000) < 0x83126f) {
          local_ff8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f58.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          if (local_f58.
              super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_f58.
              super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            dVar41 = 0.0;
            iVar11 = 0;
            iVar10 = 0;
            local_1060 = 0.0;
            local_1038 = 0.0;
            local_1040 = 0.0;
            local_1050 = 0.0;
          }
          else {
            iVar34 = 0;
            iVar11 = 0;
            iVar10 = 0;
            local_1050 = 0.0;
            local_1040 = 0.0;
            local_1038 = 0.0;
            local_1060 = 0.0;
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f58.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            do {
              dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_d78);
              BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                        ((BidirAttentionalModel<dynet::LSTMBuilder> *)local_e00,
                         (vector<int,_std::allocator<int>_> *)local_a18,
                         (vector<int,_std::allocator<int>_> *)paVar29,
                         (ComputationGraph *)((long)paVar29 + 0x18));
              pTVar24 = (Tensor *)
                        dynet::ComputationGraph::incremental_forward((Expression *)local_d78);
              fVar36 = (float)dynet::as_scalar(pTVar24);
              local_f84 = local_58.t;
              VVar30.t = (uint)(Expression *)local_d78;
              pTVar24 = (Tensor *)dynet::ComputationGraph::get_value(VVar30);
              uVar39 = dynet::as_scalar(pTVar24);
              local_ff0 = CONCAT44(local_ff0._4_4_,uVar39);
              local_f88 = local_48.t;
              pTVar24 = (Tensor *)dynet::ComputationGraph::get_value(VVar30);
              fVar37 = (float)dynet::as_scalar(pTVar24);
              local_f8c = local_38.t;
              pTVar24 = (Tensor *)dynet::ComputationGraph::get_value(VVar30);
              fVar38 = (float)dynet::as_scalar(pTVar24);
              uVar26 = (long)(*(long *)((long)paVar29 + 8) - paVar29->_M_allocated_capacity) >> 2;
              uVar27 = *(long *)(paVar29->_M_local_buf + 0x20) - *(long *)((long)paVar29 + 0x18) >>
                       2;
              iVar10 = iVar10 + -1 + (int)uVar27;
              iVar11 = iVar11 + -1 + (int)uVar26;
              if (uVar27 < uVar26) {
                uVar27 = uVar26;
              }
              iVar34 = iVar34 + -1 + (int)uVar27;
              local_1060 = local_1060 + (double)fVar36;
              local_1038 = local_1038 + (double)(float)local_ff0;
              local_1040 = local_1040 + (double)fVar37;
              auVar43 = ZEXT864((ulong)local_1040);
              local_1050 = local_1050 + (double)fVar38;
              dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_d78);
              paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar29->_M_local_buf + 0x30);
            } while (paVar29 != local_ff8);
            auVar42._8_8_ = in_XMM3_Qb;
            auVar42._0_8_ = in_XMM3_Qa;
            auVar42 = vcvtusi2sd_avx512f(auVar42,iVar34);
            dVar41 = auVar42._0_8_;
          }
          if (local_1060 < local_f18) {
            std::ofstream::ofstream((ostream *)local_d78,(string *)&local_fb0,_S_out);
            boost::archive::text_oarchive::text_oarchive
                      ((text_oarchive *)local_e00,(ostream *)local_d78,0);
            boost::serialization::
            singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_dynet::Model>_>
            ::get_instance();
            boost::archive::detail::basic_oarchive::save_object
                      (local_e00,(basic_oserializer *)local_ac8);
            boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_e00);
            boost::archive::basic_text_oprimitive<std::ostream>::~basic_text_oprimitive(local_dd0);
            local_d78 = (undefined1  [8])local_e50;
            *(undefined8 *)
             (local_d78 +
             (long)local_e50[-1].original_tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) = local_e58;
            std::filebuf::~filebuf((filebuf *)&paStack_d70);
            std::ios_base::~ios_base(local_c80);
            local_f18 = local_1060;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n***DEV [epoch=",0xf);
          auVar3._8_8_ = in_XMM3_Qb;
          auVar3._0_8_ = in_XMM3_Qa;
          auVar42 = vcvtusi2sd_avx512f(auVar3,local_fe4);
          auVar4._8_8_ = in_XMM3_Qb;
          auVar4._0_8_ = in_XMM3_Qa;
          auVar3 = vcvtusi2sd_avx512f(auVar4,((long)local_fd8.
                                                                                                        
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_fd8.
                                                                                                        
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                             -0x5555555555555555);
          poVar19 = std::ostream::_M_insert<double>(auVar42._0_8_ / auVar3._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," E = ",5);
          auVar5._8_8_ = in_XMM3_Qb;
          auVar5._0_8_ = in_XMM3_Qa;
          auVar42 = vcvtusi2sd_avx512f(auVar5,iVar10 + iVar11);
          local_1060 = local_1060 / auVar42._0_8_;
          poVar19 = std::ostream::_M_insert<double>(local_1060);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," ppl=",5);
          dVar40 = exp(local_1060);
          poVar19 = std::ostream::_M_insert<double>(dVar40);
          local_d78[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ppl_s = ",9);
          auVar6._8_8_ = in_XMM3_Qb;
          auVar6._0_8_ = in_XMM3_Qa;
          auVar42 = vcvtusi2sd_avx512f(auVar6,iVar11);
          dVar40 = exp(local_1040 / auVar42._0_8_);
          poVar19 = std::ostream::_M_insert<double>(dVar40);
          local_d78[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ppl_t = ",9);
          auVar7._8_8_ = in_XMM3_Qb;
          auVar7._0_8_ = in_XMM3_Qa;
          auVar42 = vcvtusi2sd_avx512f(auVar7,iVar10);
          dVar40 = exp(local_1038 / auVar42._0_8_);
          poVar19 = std::ostream::_M_insert<double>(dVar40);
          local_d78[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," trace = ",9);
          dVar41 = exp(local_1050 / dVar41);
          poVar19 = std::ostream::_M_insert<double>(dVar41);
          local_d78[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
        }
        dynet::Timer::~Timer((Timer *)local_f40);
      } while( true );
    }
    if (local_1018.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_1018.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      dVar41 = 0.0;
      uVar32 = 0;
      uVar31 = 0;
      local_1060 = 0.0;
      local_1048 = 0.0;
      local_1038 = 0.0;
      local_1040 = 0.0;
    }
    else {
      local_1058 = 0;
      iVar10 = 0;
      uVar27 = 0;
      uVar26 = 0;
      local_1040 = 0.0;
      local_1038 = 0.0;
      local_1048 = 0.0;
      local_1060 = 0.0;
      do {
        local_ff0 = uVar26;
        dynet::ComputationGraph::ComputationGraph((ComputationGraph *)local_d78);
        lVar23 = local_1058 * 0x30;
        BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                  ((BidirAttentionalModel<dynet::LSTMBuilder> *)local_e00,
                   (vector<int,_std::allocator<int>_> *)local_a18,
                   (vector<int,_std::allocator<int>_> *)
                   ((long)local_1018.
                          super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_1058 * 3 * 0x10),
                   (ComputationGraph *)
                   ((long)local_1018.
                          super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar23 + 0x18));
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)local_1018.
                                        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 (local_1058 * 3 + 2) * 0x10))->_M_allocated_capacity -
                            *(long *)((long)local_1018.
                                            super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     lVar23 + 0x18)) >> 2);
        paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(*(long *)((long)local_1018.
                                             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar23 + 8)
                            - ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)local_1018.
                                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  local_1058 * 3 * 0x10))->_M_allocated_capacity) >> 2);
        local_ff8 = paVar29;
        if (paVar29 < paVar33) {
          local_ff8 = paVar33;
        }
        pTVar24 = (Tensor *)dynet::ComputationGraph::forward((Expression *)local_d78);
        fVar36 = (float)dynet::as_scalar(pTVar24);
        local_f60 = local_58.t;
        pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
        fVar37 = (float)dynet::as_scalar(pTVar24);
        local_f64 = local_48.t;
        local_fb8 = uVar27;
        pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
        fVar38 = (float)dynet::as_scalar(pTVar24);
        local_f68 = local_38.t;
        pTVar24 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_d78);
        uVar39 = dynet::as_scalar(pTVar24);
        local_1000 = (double)CONCAT44(local_1000._4_4_,uVar39);
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," |||",4);
        piVar2 = *(int **)((long)local_1018.
                                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar23 + 8);
        for (piVar28 = (int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)local_1018.
                                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  local_1058 * 3 * 0x10))->_M_allocated_capacity; piVar28 != piVar2;
            piVar28 = piVar28 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          iVar11 = *piVar28;
          if ((int)((ulong)((long)sd.words_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sd.words_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) <= iVar11)
          goto LAB_0011b5df;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     sd.words_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar11]._M_dataplus._M_p,
                     sd.words_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar11]._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," |||",4);
        piVar2 = (int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)local_1018.
                                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            (local_1058 * 3 + 2) * 0x10))->_M_allocated_capacity;
        for (piVar28 = *(int **)((long)local_1018.
                                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar23 + 0x18);
            piVar28 != piVar2; piVar28 = piVar28 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          iVar11 = *piVar28;
          if ((int)((ulong)((long)td.words_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)td.words_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) <= iVar11) {
LAB_0011b5df:
            __assert_fail("id < (int)words_.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/dict.h"
                          ,0x33,"const std::string &dynet::Dict::convert(const int &) const");
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     td.words_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar11]._M_dataplus._M_p,
                     td.words_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar11]._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ||| ",5);
        auVar42 = vcvtusi2sd_avx512f(auVar43._0_16_,
                                     ((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)((long)local_1018.
                                                                                                                
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 (local_1058 * 3 + 2) * 0x10))->
                                             _M_allocated_capacity -
                                            *(long *)((long)local_1018.
                                                                                                                        
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar23 + 0x18)) >> 2) + -1);
        poVar19 = std::ostream::_M_insert<double>((double)fVar37 / auVar42._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
        auVar42 = vcvtusi2sd_avx512f(auVar43._0_16_,
                                     ((long)(*(long *)((long)local_1018.
                                                                                                                          
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar23 + 8) -
                                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)((long)local_1018.
                                                                                                              
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                local_1058 * 3 * 0x10))->_M_allocated_capacity) >> 2
                                     ) + -1);
        poVar19 = std::ostream::_M_insert<double>((double)fVar38 / auVar42._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
        local_1000 = (double)local_1000._0_4_;
        uVar26 = (long)(*(long *)((long)local_1018.
                                        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar23 + 8) -
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_1018.
                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1058 * 3 * 0x10)
                       )->_M_allocated_capacity) >> 2;
        uVar27 = (long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)local_1018.
                                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            (local_1058 * 3 + 2) * 0x10))->_M_allocated_capacity -
                       *(long *)((long)local_1018.
                                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar23 + 0x18))
                 >> 2;
        if (uVar27 < uVar26) {
          uVar27 = uVar26;
        }
        auVar42 = vcvtusi2sd_avx512f(auVar43._0_16_,uVar27 - 1);
        poVar19 = std::ostream::_M_insert<double>(local_1000 / auVar42._0_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
        iVar10 = iVar10 + -1 + (int)local_ff8;
        uVar32 = (int)local_ff0 + -1 + (int)paVar33;
        uVar26 = (ulong)uVar32;
        uVar31 = (int)local_fb8 + -1 + (int)paVar29;
        uVar27 = (ulong)uVar31;
        local_1060 = local_1060 + (double)fVar36;
        local_1048 = local_1048 + (double)fVar37;
        local_1038 = local_1038 + (double)fVar38;
        local_1040 = local_1040 + local_1000;
        dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)local_d78);
        auVar42 = auVar43._0_16_;
        local_1058 = (ulong)((int)local_1058 + 1);
        uVar25 = ((long)local_1018.
                        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1018.
                        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      } while (local_1058 <= uVar25 && uVar25 - local_1058 != 0);
      auVar3 = vcvtusi2sd_avx512f(auVar42,iVar10);
      dVar41 = auVar3._0_8_;
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    poVar19 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," E = ",5);
    auVar3 = vcvtusi2sd_avx512f(auVar42,uVar31 + uVar32);
    local_1060 = local_1060 / auVar3._0_8_;
    poVar19 = std::ostream::_M_insert<double>(local_1060);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," ppl=",5);
    dVar40 = exp(local_1060);
    poVar19 = std::ostream::_M_insert<double>(dVar40);
    local_d78[0] = (string)0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ppl_s = ",9);
    auVar3 = vcvtusi2sd_avx512f(auVar42,uVar32);
    dVar40 = exp(local_1038 / auVar3._0_8_);
    poVar19 = std::ostream::_M_insert<double>(dVar40);
    local_d78[0] = (string)0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ppl_t = ",9);
    auVar42 = vcvtusi2sd_avx512f(auVar42,uVar31);
    dVar40 = exp(local_1048 / auVar42._0_8_);
    poVar19 = std::ostream::_M_insert<double>(dVar40);
    local_d78[0] = (string)0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_d78,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," trace = ",9);
    dVar41 = exp(local_1040 / dVar41);
    poVar19 = std::ostream::_M_insert<double>(dVar41);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
    dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel(&local_550);
    dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel
              ((AttentionalModel<dynet::LSTMBuilder> *)local_a18);
    dynet::Trainer::~Trainer((Trainer *)&local_e48);
    dynet::Model::~Model((Model *)local_ac8);
    if (local_fb0 != local_fa0) {
      operator_delete(local_fb0);
    }
    if (local_ae8 != local_ad8) {
      operator_delete(local_ae8);
    }
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_1018);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_f58);
    std::
    vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_fd8);
    iVar10 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_b00);
  if (local_b28 != (void *)0x0) {
    operator_delete(local_b28);
    local_b28 = (void *)0x0;
    local_b20 = 0;
    local_b18 = 0;
    local_b10 = 0;
    local_b08 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b40);
  if (local_b68[0] != local_b58) {
    operator_delete(local_b68[0]);
  }
  local_ef8[0] = std::__cxx11::stringbuf::str;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_eb8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_ee8);
  return iVar10;
}

Assistant:

int main(int argc, char** argv) {
    dynet::initialize(argc, argv);

    // command line processing
    variables_map vm; 
    options_description opts("Allowed options");
    opts.add_options()
        ("help", "print help message")
        ("config,c", value<string>(), "config file specifying additional command line options")
        ("train,t", value<string>(), "file containing training sentences, with "
            "each line consisting of source ||| target.")
        ("devel,d", value<string>(), "file containing development sentences.")
        ("rescore,r", value<string>(), "rescore (source, target) sentence pairs")
        ("parameters,p", value<string>(), "save best parameters to this file")
        ("initialise,i", value<vector<string>>(), "load initial parameters from file")
        ("layers,l", value<int>()->default_value(LAYERS), "use <num> layers for RNN components")
        ("align,a", value<int>()->default_value(ALIGN_DIM), "use <num> dimensions for alignment projection")
        ("hidden,h", value<int>()->default_value(HIDDEN_DIM), "use <num> dimensions for recurrent hidden states")
        ("bidirectional", "use bidirectional recurrent hidden states as source embeddings, rather than word embeddings")
        ("giza", "use GIZA++ style features in attentional components (corresponds to all of the 'gz' options)")
        ("gz-position", "use GIZA++ positional index features")
        ("gz-markov", "use GIZA++ markov context features")
        ("gz-fertility", "use GIZA++ fertility type features")
        ("curriculum", "use 'curriculum' style learning, focusing on easy problems in earlier epochs")
        ("fertility,f", "learn Normal model of word fertility values")
    ;
    store(parse_command_line(argc, argv, opts), vm); 
    if (vm.count("config") > 0)
    {
        ifstream config(vm["config"].as<string>().c_str());
        store(parse_config_file(config, opts), vm); 
    }
    notify(vm);
    
    if (vm.count("help") || vm.count("train") != 1 || (vm.count("devel") != 1 && vm.count("rescore") != 1)) {
        cout << opts << "\n";
        return 1;
    }

    kSRC_SOS = sd.convert("<s>");
    kSRC_EOS = sd.convert("</s>");
    kTGT_SOS = td.convert("<s>");
    kTGT_EOS = td.convert("</s>");

    typedef vector<int> Sentence;
    typedef pair<Sentence, Sentence> SentencePair;
    vector<SentencePair> training, dev, testing;
    string line;
    cerr << "Reading training data from " << vm["train"].as<string>() << "...\n";
    training = read_corpus(vm["train"].as<string>());
    sd.freeze(); // no new word types allowed
    td.freeze(); // no new word types allowed
    VOCAB_SIZE_SRC = sd.size();
    VOCAB_SIZE_TGT = td.size();

    if (vm.count("devel")) {
        cerr << "Reading dev data from " << vm["devel"].as<string>() << "...\n";
        dev = read_corpus(vm["devel"].as<string>());
    }

    if (vm.count("rescore")) {
        cerr << "Reading test data from " << vm["rescore"].as<string>() << "...\n";
        testing = read_corpus(vm["rescore"].as<string>());
    }

    LAYERS = vm["layers"].as<int>(); 
    ALIGN_DIM = vm["align"].as<int>(); 
    HIDDEN_DIM = vm["hidden"].as<int>(); 
    BIDIR = vm.count("bidirectional");
    bool giza = vm.count("giza");
    GIZA_P = giza || vm.count("gz-position");
    GIZA_M = giza || vm.count("gz-markov");
    GIZA_F = giza || vm.count("gz-fertility");
    //FERT = vm.count("fertility");

    string fname;
    if (!vm.count("parameters")) {
        ostringstream os;
        os << "bam"
            << '_' << LAYERS
            << '_' << HIDDEN_DIM
            << '_' << ALIGN_DIM
            << "_lstm"
            << "_b" << BIDIR
	    << "_g" << (int)GIZA_P << (int)GIZA_M << (int)GIZA_F
            << "-pid" << getpid() << ".params";
        fname = os.str();
    }
    else {
        fname = vm["parameters"].as<string>();
    }

    if (!vm.count("initialise")) cerr << "Parameters will be written to: " << fname << endl;

    double best = 9e+99;

    Model model;
    SimpleSGDTrainer sgd(model);
    BidirAttentionalModel<LSTMBuilder> am(&model, 0.1);

    bool add_fer = false;
    if (vm.count("rescore"))
    {
    	am.add_fertility_params(&model);
    	add_fer = true;
    }

    if (vm.count("initialise")) {
        vector<string> init_files = vm["initialise"].as<vector<string>>();
        if (init_files.size() == 1) {
        	cerr << "Parameters will be loaded from: " << init_files[0] << endl;

            ifstream in(init_files[0]);
            boost::archive::text_iarchive ia(in);
            ia >> model;
        } else if (init_files.size() == 2) {
            cerr << "initialising from " << init_files[0] << " and " << init_files[1] << endl;
            am.initialise(init_files[0], init_files[1], model);
        } else {
            assert(false);
        }
    }

    FERT = vm.count("fertility");
    if (FERT && !add_fer) am.add_fertility_params(&model);

        if (false) {
            double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
            unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
            unsigned i = 0;
            for (auto& spair : dev) {
                ComputationGraph cg;
                auto idloss = am.build_graph(spair.first, spair.second, cg);
                dloss += as_scalar(cg.incremental_forward(idloss));
                dloss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
                dloss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
                dloss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
                dchars_s += spair.first.size() - 1;
                dchars_t += spair.second.size() - 1;
                dchars_tt += std::max(spair.first.size(), spair.second.size()) - 1;

                if (true)
                {
                    cout << "\n===== SENTENCE " << i++ << " =====\n";
                    am.s2t_model.display_tikz(spair.first, spair.second, cg, am.s2t_align, sd, td);
                    cout << "\n";
                    am.t2s_model.display_tikz(spair.second, spair.first, cg, am.t2s_align, td, sd);
                    cout << "\n";
                }
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(fname);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=0]";
            cerr << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
            cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
            cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
            cerr << " trace = " << exp(dloss_trace / dchars_tt) << ' ';
        }

    if (vm.count("rescore")) {
    	double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
    	unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
    	for (unsigned i = 0; i < testing.size(); ++i) {
            ComputationGraph cg;
            auto idloss = am.build_graph(testing[i].first, testing[i].second, cg);

            dchars_s += testing[i].first.size() - 1;
            dchars_t += testing[i].second.size() - 1;
            dchars_tt += std::max(testing[i].first.size(), testing[i].second.size()) - 1; // max or min?

            //cg.forward();
            dloss += as_scalar(cg.forward(idloss));

            double loss_s2t = as_scalar(cg.get_value(am.s2t_xent.i));
            double loss_t2s = as_scalar(cg.get_value(am.t2s_xent.i));
            double loss_trace = as_scalar(cg.get_value(am.trace_bonus.i));

            dloss_s2t += loss_s2t;
            dloss_t2s += loss_t2s;
            dloss_trace += loss_trace;

            cout << i << " |||";
            for (auto &w: testing[i].first)
                cout << " " << sd.convert(w);
            cout << " |||";
            for (auto &w: testing[i].second)
                cout << " " << td.convert(w);
            cout << " ||| " << (loss_s2t / (testing[i].second.size()-1))
                << " " << (loss_t2s / (testing[i].first.size()-1))
                << " " << (loss_trace / (std::max(testing[i].first.size(), testing[i].second.size())-1)) 
                << std::endl;
        }

    	cerr <<endl << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
    	cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
    	cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
    	cerr << " trace = " << exp(dloss_trace / dchars_tt) << endl;

        return 0;
    }

    unsigned report_every_i = 50;
    unsigned dev_every_i_reports = 500; // 500
    unsigned si = training.size();
    vector<unsigned> order(training.size());
    for (unsigned i = 0; i < order.size(); ++i) order[i] = i;
    bool first = true;
    int report = 0;
    unsigned lines = 0;
    while(1) {
        Timer iteration("completed in");
        double loss = 0, loss_s2t = 0, loss_t2s = 0, loss_trace = 0;
        unsigned chars_s = 0, chars_t = 0, chars_tt = 0;
        for (unsigned i = 0; i < report_every_i; ++i) {
            if (si == training.size()) {
                si = 0;
                if (first) { first = false; } else { sgd.update_epoch(); }
                cerr << "**SHUFFLE\n";
                shuffle(order.begin(), order.end(), *rndeng);
            }

            // build graph for this instance
            ComputationGraph cg;
            auto& spair = training[order[si]];
            chars_s += spair.first.size() - 1;
            chars_t += spair.second.size() - 1;
            chars_tt += std::max(spair.first.size(), spair.second.size()) - 1; // max or min?
            ++si;
            auto iloss = am.build_graph(spair.first, spair.second, cg);
            loss += as_scalar(cg.forward(iloss));
            loss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
            loss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
            loss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
            cg.backward(iloss);
            sgd.update(1.0f);
            ++lines;

            //if ((i+1) == report_every_i) 
            if (si == 1) {
		//Expression aligns = concatenate({transpose(am.src_align), am.tgt_align});
		//cerr << cg.get_value(aligns.i) << "\n";
                am.s2t_model.display_ascii(spair.first, spair.second, cg, am.s2t_align, sd, td);
                am.t2s_model.display_ascii(spair.second, spair.first, cg, am.t2s_align, td, sd);
		cerr << "\txent_s2t " << as_scalar(cg.get_value(am.s2t_xent.i))
		     << "\txent_t2s " << as_scalar(cg.get_value(am.t2s_xent.i))
		     << "\ttrace " << as_scalar(cg.get_value(am.trace_bonus.i)) << endl;
            }
        }
        sgd.status();
        cerr << " E = " << (loss / (chars_s + chars_t)) << " ppl=" << exp(loss / (chars_s + chars_t)) << ' '; // kind of hacky, as trace should be normalised differently
        cerr << " ppl_s = " << exp(loss_t2s / chars_s) << ' ';
        cerr << " ppl_t = " << exp(loss_s2t / chars_t) << ' ';
        cerr << " trace = " << exp(loss_trace / chars_tt) << ' ';

        // show score on dev data?
        report++;
        if (report % dev_every_i_reports == 0) {
            double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
            unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
            for (auto& spair : dev) {
                ComputationGraph cg;
                auto idloss = am.build_graph(spair.first, spair.second, cg);
                dloss += as_scalar(cg.incremental_forward(idloss));
                dloss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
                dloss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
                dloss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
                dchars_s += spair.first.size() - 1;
                dchars_t += spair.second.size() - 1;
                dchars_tt += std::max(spair.first.size(), spair.second.size()) - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(fname);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "]";
            cerr << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
            cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
            cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
            cerr << " trace = " << exp(dloss_trace / dchars_tt) << ' ';
        }
    }

    return 0;
}